

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_consume.cc
# Opt level: O2

void __thiscall
absl::lts_20250127::cord_internal::Consume
          (cord_internal *this,CordRep *rep,
          FunctionRef<void_(absl::lts_20250127::cord_internal::CordRep_*,_unsigned_long,_unsigned_long)>
          consume_fn)

{
  undefined8 uVar1;
  CordRepSubstring *pCVar2;
  size_t sVar3;
  
  uVar1 = *(undefined8 *)this;
  if (this[0xc] == (cord_internal)0x1) {
    pCVar2 = CordRep::substring((CordRep *)this);
    sVar3 = pCVar2->start;
    pCVar2 = CordRep::substring((CordRep *)this);
    this = (cord_internal *)pCVar2->child;
    if ((pCVar2->super_CordRep).refcount.count_.super___atomic_base<int>._M_i == 2) {
      operator_delete(pCVar2,0x20);
    }
    else {
      CordRep::Ref((CordRep *)this);
      CordRep::Unref(&pCVar2->super_CordRep);
    }
  }
  else {
    sVar3 = 0;
  }
  (*consume_fn.ptr_.fun)(rep,this,sVar3,uVar1);
  return;
}

Assistant:

void Consume(CordRep* rep,
             FunctionRef<void(CordRep*, size_t, size_t)> consume_fn) {
  size_t offset = 0;
  size_t length = rep->length;

  if (rep->tag == SUBSTRING) {
    offset += rep->substring()->start;
    rep = ClipSubstring(rep->substring());
  }
  consume_fn(rep, offset, length);
}